

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O0

Attribute __thiscall
cali::Caliper::create_attribute
          (Caliper *this,string *name,cali_attr_type type,int prop,int n_meta,Attribute *meta_attr,
          Variant *meta_val)

{
  ThreadData *pTVar1;
  GlobalData *pGVar2;
  bool bVar3;
  pointer ppVar4;
  cali_id_t cVar5;
  Node *pNVar6;
  void *data;
  size_t size;
  pointer ppVar7;
  vector<cali::Channel,_std::allocator<cali::Channel>_> *this_00;
  element_type *peVar8;
  cali_variant_t cVar9;
  bool local_211;
  bool local_199;
  Caliper *local_168;
  __shared_ptr_access<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_160;
  Channel *channel;
  iterator __end1;
  iterator __begin1;
  vector<cali::Channel,_std::allocator<cali::Channel>_> *__range1;
  Attribute local_138;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>
  local_130;
  const_iterator local_108;
  _Self local_100;
  _Self local_f8;
  iterator it_1;
  lock_guard<std::mutex> ga_1;
  Variant local_d8;
  Attribute local_c8;
  Attribute prop_attr;
  Attribute name_attr;
  cali_variant_t local_a8;
  Node *local_98;
  Node *tmp;
  _Self local_88;
  iterator propit;
  Node *pNStack_78;
  int n;
  Node *node;
  _Self local_68;
  _Self local_60;
  iterator it;
  lock_guard<std::mutex> local_48;
  lock_guard<std::mutex> ga;
  lock_guard<(anonymous_namespace)::siglock> g;
  Attribute *meta_attr_local;
  uint local_28;
  int n_meta_local;
  int prop_local;
  cali_attr_type type_local;
  string *name_local;
  Caliper *this_local;
  Attribute attr;
  
  if (this->sG == (GlobalData *)0x0) {
    __assert_fail("sG != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/Caliper.cpp"
                  ,0x2a4,
                  "virtual Attribute cali::Caliper::create_attribute(const std::string &, cali_attr_type, int, int, const Attribute *, const Variant *)"
                 );
  }
  std::lock_guard<(anonymous_namespace)::siglock>::lock_guard
            ((lock_guard<(anonymous_namespace)::siglock> *)&ga,&this->sT->lock);
  std::lock_guard<std::mutex>::lock_guard(&local_48,&this->sG->attribute_lock);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>_>_>
       ::find(&this->sG->attribute_map,name);
  local_68._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>_>_>
       ::end(&this->sG->attribute_map);
  bVar3 = std::operator!=(&local_60,&local_68);
  if (bVar3) {
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>_>
             ::operator->(&local_60);
    this_local = (Caliper *)(ppVar7->second).m_node;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_48);
  if (!bVar3) {
    pNStack_78 = internal::MetadataTree::type_node(&this->sT->tree,type);
    for (propit._M_node._4_4_ = 0; propit._M_node._4_4_ < n_meta;
        propit._M_node._4_4_ = propit._M_node._4_4_ + 1) {
      pNStack_78 = internal::MetadataTree::get_child
                             (&this->sT->tree,meta_attr + propit._M_node._4_4_,
                              meta_val + propit._M_node._4_4_,pNStack_78);
    }
    local_88._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::find(&this->sG->attribute_prop_presets,name);
    tmp = (Node *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::end(&this->sG->attribute_prop_presets);
    bVar3 = std::operator!=(&local_88,(_Self *)&tmp);
    local_28 = prop;
    if (bVar3) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               ::operator->(&local_88);
      local_28 = ppVar4->second;
    }
    if ((local_28 & 0x200) != 0) {
      local_28 = local_28 & 0xffffffc3 | 0x40c;
    }
    if ((local_28 & 0x3c) == 0) {
      local_28 = this->sG->attribute_default_scope | local_28;
    }
    local_98 = pNStack_78;
    while (local_98 != (Node *)0x0) {
      cVar5 = Node::attribute(local_98);
      local_199 = false;
      if (cVar5 == cali_class_aggregatable_attr_id) {
        cVar9 = (cali_variant_t)Node::data(local_98);
        local_a8 = cVar9;
        Variant::Variant((Variant *)&name_attr,true);
        local_199 = cali::operator==((Variant *)&local_a8,(Variant *)&name_attr);
      }
      if (local_199 != false) {
        local_28 = local_28 | 0x800;
        break;
      }
      local_98 = util::LockfreeIntrusiveTree<cali::Node>::parent
                           (&local_98->super_LockfreeIntrusiveTree<cali::Node>);
    }
    pNVar6 = internal::MetadataTree::node(&this->sT->tree,8);
    prop_attr = Attribute::make_attribute(pNVar6);
    pNVar6 = internal::MetadataTree::node(&this->sT->tree,10);
    local_c8 = Attribute::make_attribute(pNVar6);
    pTVar1 = this->sT;
    Variant::Variant(&local_d8,local_28);
    pNVar6 = internal::MetadataTree::get_child(&pTVar1->tree,&local_c8,&local_d8,pNStack_78);
    pTVar1 = this->sT;
    data = (void *)std::__cxx11::string::data();
    size = std::__cxx11::string::size();
    Variant::Variant((Variant *)&ga_1,CALI_TYPE_STRING,data,size);
    pNVar6 = internal::MetadataTree::get_child(&pTVar1->tree,&prop_attr,(Variant *)&ga_1,pNVar6);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)&it_1,&this->sG->attribute_lock);
    local_f8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>_>_>
         ::lower_bound(&this->sG->attribute_map,name);
    local_100._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>_>_>
         ::end(&this->sG->attribute_map);
    bVar3 = std::operator==(&local_f8,&local_100);
    local_211 = true;
    if (!bVar3) {
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>_>
               ::operator->(&local_f8);
      local_211 = std::operator!=(&ppVar7->first,name);
    }
    if (local_211 != false) {
      pGVar2 = this->sG;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>_>
      ::_Rb_tree_const_iterator(&local_108,&local_f8);
      local_138 = Attribute::make_attribute(pNVar6);
      std::make_pair<std::__cxx11::string_const&,cali::Attribute>(&local_130,name,&local_138);
      std::
      map<std::__cxx11::string,cali::Attribute,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cali::Attribute>>>
      ::insert<std::pair<std::__cxx11::string,cali::Attribute>>
                ((map<std::__cxx11::string,cali::Attribute,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cali::Attribute>>>
                  *)&pGVar2->attribute_map,local_108,&local_130);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>
      ::~pair(&local_130);
    }
    else {
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>_>
               ::operator->(&local_f8);
      this_local = (Caliper *)(ppVar7->second).m_node;
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&it_1);
    if (local_211 != false) {
      this_local = (Caliper *)Attribute::make_attribute(pNVar6);
      this_00 = &this->sG->all_channels;
      __end1 = std::vector<cali::Channel,_std::allocator<cali::Channel>_>::begin(this_00);
      channel = (Channel *)std::vector<cali::Channel,_std::allocator<cali::Channel>_>::end(this_00);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
                                    *)&channel);
        if (!bVar3) break;
        local_160 = (__shared_ptr_access<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)__gnu_cxx::
                       __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
                       ::operator*(&__end1);
        peVar8 = std::
                 __shared_ptr_access<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_160);
        local_168 = this;
        util::callback<void(cali::Caliper*,cali::Attribute_const&)>::operator()
                  (&peVar8->events,&local_168,(Attribute *)&this_local);
        __gnu_cxx::
        __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
        ::operator++(&__end1);
      }
    }
  }
  std::lock_guard<(anonymous_namespace)::siglock>::~lock_guard
            ((lock_guard<(anonymous_namespace)::siglock> *)&ga);
  return (Attribute)(Node *)this_local;
}

Assistant:

Attribute Caliper::create_attribute(
    const std::string& name,
    cali_attr_type     type,
    int                prop,
    int                n_meta,
    const Attribute*   meta_attr,
    const Variant*     meta_val
)
{
    assert(sG != 0);

    std::lock_guard<::siglock> g(sT->lock);

    // Check if an attribute with this name already exists
    {
        std::lock_guard<std::mutex> ga(sG->attribute_lock);

        auto it = sG->attribute_map.find(name);
        if (it != sG->attribute_map.end())
            return it->second;
    }

    Node* node = nullptr;

    // Get type node
    node = sT->tree.type_node(type);

    // Add metadata nodes.
    for (int n = 0; n < n_meta; ++n)
        node = sT->tree.get_child(meta_attr[n], meta_val[n], node);

    // Look for attribute properties in presets
    auto propit = sG->attribute_prop_presets.find(name);
    if (propit != sG->attribute_prop_presets.end())
        prop = propit->second;

    // Set scope to PROCESS for all global attributes and mark them as unaligned
    if (prop & CALI_ATTR_GLOBAL) {
        prop &= ~CALI_ATTR_SCOPE_MASK;
        prop |= CALI_ATTR_SCOPE_PROCESS;
        prop |= CALI_ATTR_UNALIGNED;
    }
    // Set scope to default scope if none is set
    if ((prop & CALI_ATTR_SCOPE_MASK) == 0)
        prop |= sG->attribute_default_scope;

    // Set CALI_ATTR_AGGREGATABLE property if class.aggregatable metadata is set
    for (const Node* tmp = node; tmp; tmp = tmp->parent())
        if (tmp->attribute() == cali_class_aggregatable_attr_id && tmp->data() == Variant(true)) {
            prop |= CALI_ATTR_AGGREGATABLE;
            break;
        }

    Attribute name_attr = Attribute::make_attribute(sT->tree.node(Attribute::NAME_ATTR_ID));
    Attribute prop_attr = Attribute::make_attribute(sT->tree.node(Attribute::PROP_ATTR_ID));

    node = sT->tree.get_child(prop_attr, Variant(prop), node);
    node = sT->tree.get_child(name_attr, Variant(CALI_TYPE_STRING, name.data(), name.size()), node);

    {
        // Check again if attribute already exists; might have been created by
        // another thread in the meantime.
        // We've created some redundant nodes then, but that's fine

        std::lock_guard<std::mutex> ga(sG->attribute_lock);

        auto it = sG->attribute_map.lower_bound(name);

        if (it == sG->attribute_map.end() || it->first != name)
            sG->attribute_map.insert(it, std::make_pair(name, Attribute::make_attribute(node)));
        else
            return it->second;
    }

    // Create attribute object

    Attribute attr = Attribute::make_attribute(node);

    for (auto& channel : sG->all_channels)
        channel.mP->events.create_attr_evt(this, attr);

    return attr;
}